

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::Shutdown(TCPSocket *this)

{
  std::mutex::lock(&this->mtx);
  if (((((this->closed)._M_base._M_i & 1U) == 0) && (this->shutdown == false)) &&
     (this->shutdown = true, this->ptrSendlist->head == (sendContext *)0x0)) {
    shutdown(this->fd,1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return;
}

Assistant:

void TCPSocket::Shutdown() {

	std::lock_guard<std::mutex> guard(this->mtx);
	if(this->closed || this->shutdown) {
		return;
	}

	this->shutdown = true;

	if(this->ptrSendlist->empty()){
		::shutdown(this->fd,SHUT_WR);
	}
}